

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-pta-dump.cpp
# Opt level: O1

void dumpPointerGraphData(PSNode *n,PTType type,bool dot)

{
  MemoryObject *mo_00;
  long lVar1;
  long *plVar2;
  const_iterator __end1;
  _Base_ptr p_Var3;
  long *plVar4;
  char *pcVar5;
  MemoryObject *mo;
  
  mo_00 = *(MemoryObject **)(n + 0x10);
  if (type == fi) {
    if (mo_00 == (MemoryObject *)0x0) {
      return;
    }
    if (dot) {
      printf("\\n    Memory: ---\\n");
    }
    else {
      puts("    Memory: ---");
    }
    dumpMemoryObject(mo_00,6,dot);
    if (dot) {
      return;
    }
    pcVar5 = "    -----------";
    goto LAB_00113555;
  }
  if (mo_00 == (MemoryObject *)0x0) {
    return;
  }
  pcVar5 = "    Memory map: [%p]\n";
  if (dot) {
    pcVar5 = "\\n------\\n    --- Memory map [%p] ---\\n";
  }
  printf(pcVar5,mo_00);
  if (verbose_more[0x80] == '\0') {
    if (*(long **)(n + 0x48) == *(long **)(n + 0x40)) goto LAB_00113442;
    plVar2 = *(long **)(n + 0x40);
    do {
      plVar4 = plVar2 + 1;
      lVar1 = *plVar2;
      if (*(long *)(lVar1 + 0x10) != *(long *)(n + 0x10)) break;
      plVar2 = plVar4;
    } while (plVar4 != *(long **)(n + 0x48));
    if (*(long *)(lVar1 + 0x10) != *(long *)(n + 0x10)) goto LAB_00113442;
  }
  else {
LAB_00113442:
    for (p_Var3 = (mo_00->pointsTo)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var3 != (_Base_ptr)&mo_00->pointsTo; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3))
    {
      if (dot) {
        putchar(0x3c);
        printName(*(PSNode **)(p_Var3 + 1),true);
        putchar(0x3e);
        printf("\\l");
      }
      else {
        printf("%*s",6,"");
        putchar(0x3c);
        printName(*(PSNode **)(p_Var3 + 1),dot);
        putchar(0x3e);
        putchar(10);
      }
      dumpMemoryObject((MemoryObject *)p_Var3[1]._M_parent,10,dot);
    }
  }
  if (dot) {
    return;
  }
  pcVar5 = "    ----------------";
LAB_00113555:
  puts(pcVar5);
  return;
}

Assistant:

static void dumpPointerGraphData(PSNode *n, PTType type, bool dot = false) {
    assert(n && "No node given");
    if (type == dg::LLVMPointerAnalysisOptions::AnalysisType::fi) {
        MemoryObject *mo = n->getData<MemoryObject>();
        if (!mo)
            return;

        if (dot)
            printf("\\n    Memory: ---\\n");
        else
            printf("    Memory: ---\n");

        dumpMemoryObject(mo, 6, dot);

        if (!dot)
            printf("    -----------\n");
    } else {
        PointerAnalysisFS::MemoryMapT *mm =
                n->getData<PointerAnalysisFS::MemoryMapT>();
        if (!mm)
            return;

        if (dot)
            printf(R"(\n------\n    --- Memory map [%p] ---\n)",
                   static_cast<void *>(mm));
        else
            printf("    Memory map: [%p]\n", static_cast<void *>(mm));

        if (verbose_more || mmChanged(n))
            dumpMemoryMap(mm, 6, dot);

        if (!dot)
            printf("    ----------------\n");
    }
}